

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawListSplitter::SetCurrentChannel(ImDrawListSplitter *this,ImDrawList *draw_list,int idx)

{
  ImDrawCmdHeader *pIVar1;
  ImDrawChannel *pIVar2;
  ImVector<unsigned_short> *pIVar3;
  unsigned_short *puVar4;
  undefined8 uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  long lVar11;
  ImDrawCmd *pIVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if ((idx < 0) || (this->_Count <= idx)) {
    __assert_fail("idx >= 0 && idx < _Count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_draw.cpp"
                  ,0x701,"void ImDrawListSplitter::SetCurrentChannel(ImDrawList *, int)");
  }
  if (this->_Current == idx) {
    return;
  }
  iVar6 = (draw_list->CmdBuffer).Capacity;
  pIVar12 = (draw_list->CmdBuffer).Data;
  pIVar2 = (this->_Channels).Data + this->_Current;
  (pIVar2->_CmdBuffer).Size = (draw_list->CmdBuffer).Size;
  (pIVar2->_CmdBuffer).Capacity = iVar6;
  (pIVar2->_CmdBuffer).Data = pIVar12;
  iVar6 = (draw_list->IdxBuffer).Capacity;
  puVar4 = (draw_list->IdxBuffer).Data;
  pIVar3 = &(this->_Channels).Data[this->_Current]._IdxBuffer;
  pIVar3->Size = (draw_list->IdxBuffer).Size;
  pIVar3->Capacity = iVar6;
  pIVar3->Data = puVar4;
  this->_Current = idx;
  pIVar2 = (this->_Channels).Data + (uint)idx;
  iVar6 = (pIVar2->_CmdBuffer).Capacity;
  pIVar12 = (pIVar2->_CmdBuffer).Data;
  (draw_list->CmdBuffer).Size = (pIVar2->_CmdBuffer).Size;
  (draw_list->CmdBuffer).Capacity = iVar6;
  (draw_list->CmdBuffer).Data = pIVar12;
  pIVar3 = &(this->_Channels).Data[(uint)idx]._IdxBuffer;
  iVar6 = pIVar3->Capacity;
  puVar4 = pIVar3->Data;
  (draw_list->IdxBuffer).Size = pIVar3->Size;
  (draw_list->IdxBuffer).Capacity = iVar6;
  (draw_list->IdxBuffer).Data = puVar4;
  draw_list->_IdxWritePtr = (draw_list->IdxBuffer).Data + (draw_list->IdxBuffer).Size;
  lVar11 = (long)(draw_list->CmdBuffer).Size;
  if (lVar11 == 0) {
    pIVar12 = (ImDrawCmd *)0x0;
  }
  else {
    pIVar12 = (draw_list->CmdBuffer).Data + lVar11 + -1;
  }
  if (pIVar12 != (ImDrawCmd *)0x0) {
    pIVar1 = &draw_list->_CmdHeader;
    if (pIVar12->ElemCount == 0) {
      fVar7 = (pIVar1->ClipRect).x;
      fVar8 = (pIVar1->ClipRect).y;
      fVar9 = (draw_list->_CmdHeader).ClipRect.z;
      fVar10 = (draw_list->_CmdHeader).ClipRect.w;
      uVar5 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
      *(undefined8 *)&(pIVar12->ClipRect).w = *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
      *(undefined8 *)((long)&pIVar12->TextureId + 4) = uVar5;
      (pIVar12->ClipRect).x = fVar7;
      (pIVar12->ClipRect).y = fVar8;
      (pIVar12->ClipRect).z = fVar9;
      (pIVar12->ClipRect).w = fVar10;
      return;
    }
    auVar14[0] = -(*(char *)&(pIVar1->ClipRect).x == *(char *)&(pIVar12->ClipRect).x);
    auVar14[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                  *(char *)((long)&(pIVar12->ClipRect).x + 1));
    auVar14[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                  *(char *)((long)&(pIVar12->ClipRect).x + 2));
    auVar14[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                  *(char *)((long)&(pIVar12->ClipRect).x + 3));
    auVar14[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y == *(char *)&(pIVar12->ClipRect).y);
    auVar14[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                  *(char *)((long)&(pIVar12->ClipRect).y + 1));
    auVar14[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                  *(char *)((long)&(pIVar12->ClipRect).y + 2));
    auVar14[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                  *(char *)((long)&(pIVar12->ClipRect).y + 3));
    auVar14[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z == *(char *)&(pIVar12->ClipRect).z);
    auVar14[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                  *(char *)((long)&(pIVar12->ClipRect).z + 1));
    auVar14[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                   *(char *)((long)&(pIVar12->ClipRect).z + 2));
    auVar14[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                    *(char *)((long)&(pIVar12->ClipRect).z + 3));
    auVar14[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w == *(char *)&(pIVar12->ClipRect).w
                    );
    auVar14[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&(pIVar12->ClipRect).w + 1));
    auVar14[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&(pIVar12->ClipRect).w + 2));
    auVar14[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&(pIVar12->ClipRect).w + 3));
    auVar13[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w == *(char *)&(pIVar12->ClipRect).w);
    auVar13[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                  *(char *)((long)&(pIVar12->ClipRect).w + 1));
    auVar13[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                  *(char *)((long)&(pIVar12->ClipRect).w + 2));
    auVar13[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                  *(char *)((long)&(pIVar12->ClipRect).w + 3));
    auVar13[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId == *(char *)&pIVar12->TextureId);
    auVar13[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                  *(char *)((long)&pIVar12->TextureId + 1));
    auVar13[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                  *(char *)((long)&pIVar12->TextureId + 2));
    auVar13[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                  *(char *)((long)&pIVar12->TextureId + 3));
    auVar13[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                  *(char *)((long)&pIVar12->TextureId + 4));
    auVar13[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                  *(char *)((long)&pIVar12->TextureId + 5));
    auVar13[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                   *(char *)((long)&pIVar12->TextureId + 6));
    auVar13[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                    *(char *)((long)&pIVar12->TextureId + 7));
    auVar13[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset == (char)pIVar12->VtxOffset);
    auVar13[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                    *(char *)((long)&pIVar12->VtxOffset + 1));
    auVar13[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                    *(char *)((long)&pIVar12->VtxOffset + 2));
    auVar13[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                    *(char *)((long)&pIVar12->VtxOffset + 3));
    auVar13 = auVar13 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff) {
      return;
    }
  }
  ImDrawList::AddDrawCmd(draw_list);
  return;
}

Assistant:

void ImDrawListSplitter::SetCurrentChannel(ImDrawList* draw_list, int idx)
{
    IM_ASSERT(idx >= 0 && idx < _Count);
    if (_Current == idx)
        return;

    // Overwrite ImVector (12/16 bytes), four times. This is merely a silly optimization instead of doing .swap()
    memcpy(&_Channels.Data[_Current]._CmdBuffer, &draw_list->CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&_Channels.Data[_Current]._IdxBuffer, &draw_list->IdxBuffer, sizeof(draw_list->IdxBuffer));
    _Current = idx;
    memcpy(&draw_list->CmdBuffer, &_Channels.Data[idx]._CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&draw_list->IdxBuffer, &_Channels.Data[idx]._IdxBuffer, sizeof(draw_list->IdxBuffer));
    draw_list->_IdxWritePtr = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size;

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = (draw_list->CmdBuffer.Size == 0) ? NULL : &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd == NULL)
        draw_list->AddDrawCmd();
    else if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();
}